

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdparser.hpp
# Opt level: O0

void __thiscall
cli::Parser::set_optional<bool>
          (Parser *this,string *name,string *alternative,bool defaultValue,string *description)

{
  CmdArgument<bool> *this_00;
  CmdArgument<bool> *local_50 [3];
  CmdArgument<bool> *local_38;
  CmdArgument<bool> *command;
  string *description_local;
  string *psStack_20;
  bool defaultValue_local;
  string *alternative_local;
  string *name_local;
  Parser *this_local;
  
  command = (CmdArgument<bool> *)description;
  description_local._7_1_ = defaultValue;
  psStack_20 = alternative;
  alternative_local = name;
  name_local = &this->_appname;
  this_00 = (CmdArgument<bool> *)operator_new(0xb0);
  CmdArgument<bool>::CmdArgument(this_00,alternative_local,psStack_20,(string *)command,false);
  this_00->value = (bool)(description_local._7_1_ & 1);
  local_50[0] = this_00;
  local_38 = this_00;
  std::vector<cli::Parser::CmdBase_*,_std::allocator<cli::Parser::CmdBase_*>_>::push_back
            (&this->_commands,(value_type *)local_50);
  return;
}

Assistant:

void set_optional(const std::string& name, const std::string& alternative, T defaultValue, const std::string& description = "") {
			auto command = new CmdArgument<T> { name, alternative, description, false };
			command->value = defaultValue;
			_commands.push_back(command);
		}